

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
           *this,GraphicsPipelineStateCreateInfo *CI)

{
  pointer puVar1;
  ulong local_20;
  size_t i;
  GraphicsPipelineStateCreateInfo *CI_local;
  PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  *this_local;
  
  memcpy(this,CI,0x158);
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX
            (&this->ResourceLayout,&(CI->super_PipelineStateCreateInfo).PSODesc.ResourceLayout);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->StringPool);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::vector(&this->Objects);
  std::
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ::vector(&this->Signatures);
  CopyPSOCreateInternalInfo
            ((Diligent *)&this->InternalData,(CI->super_PipelineStateCreateInfo).pInternalData);
  SetName(this,(this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
               super_DeviceObjectAttribs.Name);
  for (local_20 = 0; local_20 < (CI->super_PipelineStateCreateInfo).ResourceSignaturesCount;
      local_20 = local_20 + 1) {
    AddSignature(this,(CI->super_PipelineStateCreateInfo).ppResourceSignatures[local_20]);
  }
  if ((CI->super_PipelineStateCreateInfo).pPSOCache != (IPipelineStateCache *)0x0) {
    SetPipelineStateCache(this,(CI->super_PipelineStateCreateInfo).pPSOCache);
  }
  memcpy(&(this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
          ResourceLayout,&this->ResourceLayout,0x28);
  puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->InternalData);
  (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.pInternalData = puVar1
  ;
  return;
}

Assistant:

PipelineStateCreateInfoX(const CreateInfoType& CI) noexcept :
        CreateInfoType{CI},
        ResourceLayout{CI.PSODesc.ResourceLayout},
        InternalData{CopyPSOCreateInternalInfo(CI.pInternalData)}
    {
        SetName(this->PSODesc.Name);
        for (size_t i = 0; i < CI.ResourceSignaturesCount; ++i)
            AddSignature(CI.ppResourceSignatures[i]);
        if (CI.pPSOCache != nullptr)
            SetPipelineStateCache(CI.pPSOCache);
        this->PSODesc.ResourceLayout = ResourceLayout;
        this->pInternalData          = InternalData.get();
    }